

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
* __thiscall
pstore::region::factory::create<pstore::file::in_memory,pstore::in_memory_mapper>
          (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           *__return_storage_ptr__,factory *this,shared_ptr<pstore::file::in_memory> *file)

{
  uint64_t bytes_to_map;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> builder;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_50;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> local_40;
  
  bytes_to_map = ((file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->eof_;
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>);
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::region_builder
            (&local_40,(shared_ptr<pstore::file::in_memory> *)&local_50,this->full_size_,
             this->min_size_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::operator()
            (__return_storage_ptr__,&local_40,bytes_to_map);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto factory::create (std::shared_ptr<File> file) -> std::vector<memory_mapper_ptr> {

            // There's no lock on the file when we call the size() method here. However, the file
            // is only allowed to grow so if it changes then the worst outcome is that we end up
            // memory mapping more of it beyond the logical size.

            std::uint64_t const file_size = file->size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (),
                                                        this->min_size ());
            return builder (file_size);
        }